

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_pa_stream *
ma_device__pa_stream_new__pulse
          (ma_device *pDevice,char *pStreamName,ma_pa_sample_spec *ss,ma_pa_channel_map *cmap)

{
  ma_pa_stream *pmVar1;
  char actualStreamName [256];
  char acStack_118 [8];
  char local_110 [248];
  
  if (pStreamName == (char *)0x0) {
    ma_strcpy_s(acStack_118,0x100,"miniaudio:");
    ma_itoa_s(ma_device__pa_stream_new__pulse::g_StreamCounter,local_110,0xf8,L'\n');
  }
  else {
    ma_strncpy_s(acStack_118,0x100,pStreamName,0xffffffffffffffff);
  }
  ma_device__pa_stream_new__pulse::g_StreamCounter =
       ma_device__pa_stream_new__pulse::g_StreamCounter + L'\x01';
  pmVar1 = (ma_pa_stream *)
           (*(pDevice->pContext->field_14).alsa.snd_pcm_sw_params_set_start_threshold)
                     ((pDevice->field_24).alsa.pPCMCapture,acStack_118,ss,cmap);
  return pmVar1;
}

Assistant:

static ma_pa_stream* ma_device__pa_stream_new__pulse(ma_device* pDevice, const char* pStreamName, const ma_pa_sample_spec* ss, const ma_pa_channel_map* cmap)
{
    static int g_StreamCounter = 0;
    char actualStreamName[256];

    if (pStreamName != NULL) {
        ma_strncpy_s(actualStreamName, sizeof(actualStreamName), pStreamName, (size_t)-1);
    } else {
        ma_strcpy_s(actualStreamName, sizeof(actualStreamName), "miniaudio:");
        ma_itoa_s(g_StreamCounter, actualStreamName + 8, sizeof(actualStreamName)-8, 10);  /* 8 = strlen("miniaudio:") */
    }
    g_StreamCounter += 1;

    return ((ma_pa_stream_new_proc)pDevice->pContext->pulse.pa_stream_new)((ma_pa_context*)pDevice->pulse.pPulseContext, actualStreamName, ss, cmap);
}